

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O3

char * borg_prepared_aux(wchar_t depth)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  wchar_t wVar6;
  
  if (borg.ready_morgoth == L'\xffffffff') {
    borg.ready_morgoth = L'\0';
  }
  if (borg.trait[0x6b] == 0) {
    if (depth == L'\0') {
      return (char *)0x0;
    }
    if (borg.trait[0x1a] < 1) {
      return "1 Lite";
    }
    if (borg.trait[0x27] < 5) {
      return "5 Food";
    }
    if (depth < L'\x02') {
      return (char *)0x0;
    }
    iVar1 = borg_cfg[10];
    if (iVar1 == 0) {
      uVar2 = borg.trait[0x1c];
      if ((int)uVar2 < 0x1e) {
        return "30 hp";
      }
      if (depth == L'\x02') {
        return (char *)0x0;
      }
      switch(borg.trait[0x19]) {
      case 0:
      case 5:
      case 7:
      case 8:
        if (uVar2 < 0x32) {
LAB_0023df3d:
          return "50 hp";
        }
        if (borg.trait[0x24] < 4) {
          return "4 clevel";
        }
        break;
      case 1:
      case 4:
        if (uVar2 < 0x3c) goto LAB_0023e1a8;
        if (borg.trait[0x24] < 0xb) {
          return "11 clevel";
        }
        break;
      case 2:
      case 3:
        if (uVar2 < 0x28) {
          return "40 hp";
        }
        if (borg.trait[0x24] < 9) {
          return "9 level";
        }
        break;
      case 6:
        if (uVar2 < 0x32) goto LAB_0023df3d;
        if (borg.trait[0x24] < 8) {
          return "8 clevel";
        }
      }
    }
    else if (depth == L'\x02') {
      return (char *)0x0;
    }
    wVar6 = borg.trait[0x24];
    if ((wVar6 < L'\x1e') && (borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7] < 2)) {
      return "2 cure";
    }
    if (4 < (uint)depth) {
      if ((iVar1 == 0) && (borg.trait[0x69] != 0)) {
        switch(borg.trait[0x19]) {
        case 0:
        case 5:
        case 7:
        case 8:
          if (borg.trait[0x1c] < 0x3c) {
LAB_0023e1a8:
            return "60 hp";
          }
          if (wVar6 < L'\x06') {
            return "6 clevel";
          }
          break;
        case 1:
        case 4:
          if (borg.trait[0x1c] < 0x50) {
            return "80 hp";
          }
          if (wVar6 < L'\x0f') {
            return "15 level";
          }
          break;
        case 2:
        case 3:
          if (borg.trait[0x1c] < 0x3c) goto LAB_0023e1a8;
          if (wVar6 < L'\x0f') {
            return "15 clevel";
          }
          break;
        case 6:
          if (borg.trait[0x1c] < 0x3c) goto LAB_0023e1a8;
          if (wVar6 < L'\n') {
            return "10 clevel";
          }
        }
      }
      if ((wVar6 < L'\x1e') && (borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7] < 2)) {
        return "2 cures (clw + csw + ccw)";
      }
      if (borg.trait[0x26] < 1) {
        return "1 recall";
      }
      if (9 < (uint)depth) {
        if ((borg.trait[0x1a] == 1) && (borg.trait[0x19] != 4)) {
          return "2 light radius";
        }
        if (borg.trait[0xd4] + borg.trait[0xd3] < 2) {
          return "2 tele + teleport staffs";
        }
        if (iVar1 == 0) {
          switch(borg.trait[0x19]) {
          case 0:
          case 8:
            if ((uint)depth < 0x14 && wVar6 < depth + L'\xfffffffc') {
              return "dlevel - 4 >= clevel";
            }
            break;
          case 1:
          case 4:
            if (wVar6 < depth + L'\x05' && wVar6 < L'\x1d') {
              return "dlevel + 5 > = clevel";
            }
            break;
          case 2:
          case 3:
          case 5:
          case 6:
          case 7:
            if ((uint)depth < 0x14 && wVar6 < depth) {
              return "dlevel >= clevel";
            }
          }
        }
        if ((wVar6 < L'\x1e') && (borg.trait[0xe7] < 3)) {
          return "ccw < 3";
        }
        if (((borg.trait[0x33] == 0) && (borg.trait[0x103] == 0)) && (borg.trait[0x25] == 0)) {
          return "See Invis : ESP";
        }
        if (0x13 < (uint)depth) {
          if (borg.trait[0x56] == 0) {
            return "free action";
          }
          if (depth != L'\x14') {
            if (borg.trait[0x57] == 0) {
              return "resist fire";
            }
            if (borg.trait[0x46] + borg.trait[0x48] + borg.trait[0x47] < 2) {
              return "2 basic resists";
            }
            if (*borg.trait < 7) {
              return "low STR";
            }
            wVar6 = borg_spell_stat();
            if ((wVar6 != L'\xffffffff') && (borg.trait[wVar6] < 7)) {
              return "low spell stat";
            }
            uVar2 = borg.trait[3];
            if ((int)uVar2 < 7) {
              return "low DEX";
            }
            uVar3 = borg.trait[4];
            if ((int)uVar3 < 7) {
              return "low CON";
            }
            iVar1 = borg_cfg[10];
            if (iVar1 == 0) {
              switch(borg.trait[0x19]) {
              case 0:
              case 8:
                if (borg.trait[0x24] < depth + L'\x05' && borg.trait[0x24] < 0x27) {
                  return "dlevel + 5 >= clevel";
                }
                break;
              case 1:
              case 4:
                iVar4 = borg.trait[0x24];
                if (iVar4 < depth + L'\b' && iVar4 < 0x27) {
LAB_0023e48b:
                  return "dlevel + 8 >= clevel";
                }
                if ((iVar4 - 0x27U < 6) && (iVar4 * 2 + L'\xffffffd2' < depth)) {
                  return "(clevel-38)*2+30 < dlevel";
                }
                break;
              case 2:
              case 3:
                if (borg.trait[0x24] < depth + L'\r' && borg.trait[0x24] < 0x2f) {
                  return "dlevel + 13 >= clevel";
                }
                break;
              case 5:
                if (borg.trait[0x24] < depth + L'\a' && borg.trait[0x24] < 0x29) {
                  return "dlevel + 7 >= clevel";
                }
                break;
              case 6:
                if (borg.trait[0x24] < depth + L'\n' && borg.trait[0x24] < 0x2c) {
                  return "dlevel + 10 >= clevel";
                }
                break;
              case 7:
                if (borg.trait[0x24] < depth + L'\b' && borg.trait[0x24] - 0x1dU < 0xd)
                goto LAB_0023e48b;
              }
            }
            if (0x19 < (uint)depth) {
              if (borg.trait[0x58] == 0) {
                return "resist cold";
              }
              if (borg.trait[0x59] == 0) {
                return "resist elec";
              }
              if (borg.trait[0x5a] == 0) {
                return "resist acid";
              }
              if (borg.trait[0xd4] + borg.trait[0xd3] < 6) {
                return "6 tell + telep staffs";
              }
              iVar4 = borg.trait[0x24];
              if ((iVar4 < 0x1e) && (borg.trait[0xe8] + borg.trait[0xe7] < 10)) {
                return "10 ccw + csw";
              }
              if (0x21 < (uint)depth) {
                if (iVar1 == 0 && iVar4 < 0x28) {
                  return "level 40";
                }
                if (0x27 < (uint)depth) {
                  if (borg.trait[0x5b] == 0) {
                    return "resist pois";
                  }
                  if (borg.trait[0x60] == 0) {
                    return "resist conf";
                  }
                  if (*borg.trait < 0x10) {
                    return "STR < 16";
                  }
                  if ((wVar6 != L'\xffffffff') && (borg.trait[wVar6] < 0x10)) {
                    return "spell stat < 16";
                  }
                  if (uVar2 < 0x10) {
                    return "dex < 16";
                  }
                  if (uVar3 < 0x10) {
                    return "con < 16";
                  }
                  if (0x2d < (uint)depth) {
                    uVar5 = borg.trait[0x2c];
                    if ((int)uVar5 < 0x73) {
                      return "+5 speed";
                    }
                    if ((borg.trait[0xd6] < 1) && (borg.trait[0xd7] < 1)) {
                      return "1 heal";
                    }
                    if ((iVar1 == 0) && (borg.trait[0x1c] < 500)) {
                      return "HP 500";
                    }
                    if ((uint)*borg.trait < 0x3a) {
                      return "str < 18(40)";
                    }
                    if ((wVar6 != L'\xffffffff') && (borg.trait[wVar6] < 0x76)) {
                      return "spell stat needs to be max";
                    }
                    if (uVar2 < 0x4e) {
                      return "dex < 18 (60)";
                    }
                    if (uVar3 < 0x4e) {
                      return "con < 18 (60)";
                    }
                    if ((iVar4 < 0x32) && (borg.trait[0x67] == 0)) {
                      return "hold life";
                    }
                    if (0x37 < (uint)depth) {
                      if ((borg.trait[0xd6] < 2) && (borg.trait[0xd7] < 1)) {
                        return "2 heal + *heal*";
                      }
                      if (borg.trait[0x5f] == 0) {
                        return "resist blind";
                      }
                      if (borg.trait[0x25] == 0) {
                        return "ESP";
                      }
                      if (0x3b < (uint)depth) {
                        if (uVar5 < 0x78) {
                          return "+10 speed";
                        }
                        if (borg.trait[0x65] == 0) {
                          return "resist chaos";
                        }
                        if (borg.trait[0x66] == 0) {
                          return "resist disenchant";
                        }
                        if (0x50 < (uint)depth) {
                          if (uVar5 < 0x82) {
                            return "+20 Speed";
                          }
                          if ((99 < (uint)depth) && (borg.trait[0x6b] == 0)) {
                            if ((100 < borg.trait[0x1f]) && (borg.has[kv_potion_restore_mana] < 0xf)
                               ) {
                              return "10 restore mana";
                            }
                            if (borg.has[kv_potion_healing] < 5) {
                              return "5 Heal";
                            }
                            if (borg.trait[0xd8] + borg.trait[0xd7] < 0xf) {
                              return "15 *heal* or life";
                            }
                            if (borg.trait[0xda] < 10) {
                              return "10 speed potions";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    borg.ready_morgoth = L'\x01';
  }
  return (char *)0x0;
}

Assistant:

static const char *borg_prepared_aux(int depth)
{
    if (-1 == borg.ready_morgoth)
        borg.ready_morgoth = 0;
    if (borg.trait[BI_KING]) {
        borg.ready_morgoth = 1;
        return (NULL);
    }

    /* Always ready for the town */
    if (!depth)
        return (NULL);

    /*** Essential Items for Level 1 ***/

    /* Require lite (any) */
    if (borg.trait[BI_LIGHT] < 1)
        return ("1 Lite");

    /* Require food */
    if (borg.trait[BI_FOOD] < 5)
        return ("5 Food");

    /* Usually ready for level 1 */
    if (depth <= 1)
        return ((char *)NULL);

    /*** Essential Items for Level 2 ***/

    /* Require fuel */
    if (borg.trait[BI_AFUEL] < 5 && !borg.trait[BI_LIGHT])
        return ("5 Fuel");

    /* Require recall */
    /* if (borg.trait[BI_RECALL] < 1) return ("1 recall"); */

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* Require 30 hp */
        if (borg.trait[BI_MAXHP] < 30)
            return ("30 hp");
    }

    /* Usually ready for level 2 */
    if (depth <= 2)
        return ((char *)NULL);

    /*** Essential Items for Level 3 and 4 ***/

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 8)
                return ("8 clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXHP] < 40)
                return ("40 hp");
            if (borg.trait[BI_MAXCLEVEL] < 9)
                return ("9 level");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXHP] < 60)
                return ("60 hp");
            if (borg.trait[BI_MAXCLEVEL] < 11)
                return ("11 clevel");
            break;
        }
    }

    /* Potions of Cure Serious Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && borg.trait[BI_ACLW] + borg.trait[BI_ACSW] + borg.trait[BI_ACCW] < 2)
        return ("2 cure");

    /* Usually ready for level 3 and 4 */
    if (depth <= 4)
        return ((char *)NULL);

    /*** Essential Items for Level 5 to 9 ***/

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        if (borg.trait[BI_CDEPTH]) {
            switch (borg.trait[BI_CLASS]) {
            case CLASS_WARRIOR:
            case CLASS_BLACKGUARD:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_ROGUE:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 10)
                    return ("10 clevel");
                break;
            case CLASS_PRIEST:
            case CLASS_DRUID:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 15)
                    return ("15 clevel");
                break;
            case CLASS_PALADIN:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_RANGER:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_MAGE:
            case CLASS_NECROMANCER:
                if (borg.trait[BI_MAXHP] < 80)
                    return ("80 hp");
                if (borg.trait[BI_MAXCLEVEL] < 15)
                    return ("15 level");
                break;
            }
        }
    }

    /* Potions of Cure Serious/Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && borg.trait[BI_ACLW] + borg.trait[BI_ACSW] + borg.trait[BI_ACCW] < 2)
        return ("2 cures (clw + csw + ccw)");

    /* Scrolls of Word of Recall */
    if (borg.trait[BI_RECALL] < 1)
        return ("1 recall");

    /* Usually ready for level 5 to 9 */
    if (depth <= 9)
        return ((char *)NULL);

    /*** Essential Items for Level 10 to 19 ***/

    /* Require light (radius 2) */    /* necromancers like the dark */
    if (borg.trait[BI_LIGHT] < 2
        && (borg.trait[BI_CLASS] != CLASS_NECROMANCER))
        return "2 light radius";

    /* Escape or Teleport */
    if (borg.trait[BI_ATELEPORT] + borg.trait[BI_AESCAPE] < 2)
        return ("2 tele + teleport staffs");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXCLEVEL] < (depth - 4) && depth <= 19)
                return ("dlevel - 4 >= clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 5)
                && borg.trait[BI_MAXCLEVEL] <= 28)
                return ("dlevel + 5 > = clevel");
            break;
        }
    }

    /* Potions of Cure Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30) && borg.trait[BI_ACCW] < 3)
        return ("ccw < 3");

    /* See invisible */
    /* or telepathy */
    if ((!borg.trait[BI_SINV] && !borg.trait[BI_DINV] && !borg.trait[BI_ESP]))
        return ("See Invis : ESP");

    /* Usually ready for level 10 to 19 */
    if (depth <= 19)
        return ((char *)NULL);

    /*** Essential Items for Level 20 ***/

    /* Free action */
    if (!borg.trait[BI_FRACT])
        return ("free action");

    /* ready for level 20 */
    if (depth <= 20)
        return ((char *)NULL);

    /*** Essential Items for Level 25 ***/

    /* must have fire + 2 other basic resists */
    if (!borg.trait[BI_SRFIRE])
        return ("resist fire");
    {
        int basics = borg.trait[BI_RACID] + borg.trait[BI_RCOLD]
                     + borg.trait[BI_RELEC];

        if (basics < 2)
            return ("2 basic resists");
    }
    /* have some minimal stats */
    if (borg.trait[BI_STR] < 7)
        return ("low STR");

    int spell_stat = borg_spell_stat();
    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 7)
            return ("low spell stat");
    }
    if (borg.trait[BI_DEX] < 7)
        return ("low DEX");
    if (borg.trait[BI_CON] < 7)
        return ("low CON");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 5)
                && borg.trait[BI_MAXCLEVEL] <= 38)
                return ("dlevel + 5 >= clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 10)
                && borg.trait[BI_MAXCLEVEL] <= 43)
                return ("dlevel + 10 >= clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 13)
                && borg.trait[BI_MAXCLEVEL] <= 46)
                return ("dlevel + 13 >= clevel");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 7)
                && borg.trait[BI_MAXCLEVEL] <= 40)
                return ("dlevel + 7 >= clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 8)
                && borg.trait[BI_MAXCLEVEL] <= 41
                && borg.trait[BI_MAXCLEVEL] > 28)
                return ("dlevel + 8 >= clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 8)
                && borg.trait[BI_MAXCLEVEL] <= 38)
                return ("dlevel + 8 >= clevel");
            if (((borg.trait[BI_MAXCLEVEL] - 38) * 2 + 30) < depth
                && borg.trait[BI_MAXCLEVEL] <= 44
                && borg.trait[BI_MAXCLEVEL] > 38)
                return ("(clevel-38)*2+30 < dlevel");
            break;
        }
    }

    /* Ready for level 25 */
    if (depth <= 25)
        return ((char *)NULL);

    /*** Essential Items for Level 25 to 39 ***/

    /* All Basic resistance*/
    if (!borg.trait[BI_SRCOLD])
        return ("resist cold");
    if (!borg.trait[BI_SRELEC])
        return ("resist elec");
    if (!borg.trait[BI_SRACID])
        return ("resist acid");

    /* Escape and Teleport */
    if (borg.trait[BI_ATELEPORT] + borg.trait[BI_AESCAPE] < 6)
        return ("6 tell + telep staffs");

    /* Cure Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && (borg.trait[BI_ACCW] + borg.trait[BI_ACSW]) < 10)
        return ("10 ccw + csw");

    /* Ready for level 33 */
    if (depth <= 33)
        return ((char *)NULL);

    /* Minimal level */
    if (borg.trait[BI_MAXCLEVEL] < 40 && !borg_cfg[BORG_PLAYS_RISKY])
        return ("level 40");

    /* Usually ready for level 20 to 39 */
    if (depth <= 39)
        return ((char *)NULL);

    /*** Essential Items for Level 40 to 45 ***/

    /* Resist */
    if (!borg.trait[BI_SRPOIS])
        return ("resist pois");
    if (!borg.trait[BI_SRCONF])
        return ("resist conf");

    if (borg.trait[BI_STR] < 16)
        return ("STR < 16");

    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 16)
            return ("spell stat < 16");
    }
    if (borg.trait[BI_DEX] < 16)
        return ("dex < 16");
    if (borg.trait[BI_CON] < 16)
        return ("con < 16");

    /* Ok to continue */
    if (depth <= 45)
        return ((char *)NULL);

    /*** Essential Items for Level 46 to 55 ***/

    /*  Must have +5 speed after level 46 */
    if (borg.trait[BI_SPEED] < 115)
        return ("+5 speed");

    /* Potions of heal */
    if (borg.trait[BI_AHEAL] < 1 && (borg.trait[BI_AEZHEAL] < 1))
        return ("1 heal");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* Minimal hitpoints */
        if (borg.trait[BI_MAXHP] < 500)
            return ("HP 500");
    }

    /* High stats XXX XXX XXX */
    if (borg.trait[BI_STR] < 18 + 40)
        return ("str < 18(40)");

    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 18 + 100)
            return ("spell stat needs to be max");
    }
    if (borg.trait[BI_DEX] < 18 + 60)
        return ("dex < 18 (60)");
    if (borg.trait[BI_CON] < 18 + 60)
        return ("con < 18 (60)");

    /* Hold Life */
    if (!borg.trait[BI_SHLIFE] && (borg.trait[BI_MAXCLEVEL] < 50))
        return ("hold life");

    /* Usually ready for level 46 to 55 */
    if (depth <= 55)
        return ((char *)NULL);

    /*** Essential Items for Level 55 to 59 ***/

    /* Potions of heal */
    if (borg.trait[BI_AHEAL] < 2 && borg.trait[BI_AEZHEAL] < 1)
        return ("2 heal + *heal*");

    /* Resists */
    if (!borg.trait[BI_SRBLIND])
        return ("resist blind");

    /* Must have resist nether */
    /*    if (!borg_settings[BORG_PLAYS_RISKY] && !borg.trait[BI_SRNTHR]) return
     * ("resist nether"); */

    /* Telepathy, better have it by now */
    if (!borg.trait[BI_ESP])
        return ("ESP");

    /* Usually ready for level 55 to 59 */
    if (depth <= 59)
        return ((char *)NULL);

    /*** Essential Items for Level 61 to 80 ***/

    /* Must have +10 speed */
    if (borg.trait[BI_SPEED] < 120)
        return ("+10 speed");

    /* Resists */
    if (!borg.trait[BI_SRKAOS])
        return ("resist chaos");
    if (!borg.trait[BI_SRDIS])
        return ("resist disenchant");

    /* Usually ready for level 61 to 80 */
    if (depth <= 80)
        return ((char *)NULL);

    /*** Essential Items for Level 81-85 ***/
    /* Minimal Speed */
    if (borg.trait[BI_SPEED] < 130)
        return ("+20 Speed");

    /* Usually ready for level 81 to 85 */
    if (depth <= 85)
        return ((char *)NULL);

    /*** Essential Items for Level 86-99 ***/

    /* Usually ready for level 86 to 99 */
    if (depth <= 99)
        return ((char *)NULL);

    /*** Essential Items for Level 100 ***/

    /* must have lots of restore mana to go after MORGOTH */
    if (!borg.trait[BI_KING]) {
        if ((borg.trait[BI_MAXSP] > 100)
            && (borg.has[kv_potion_restore_mana] < 15))
            return ("10 restore mana");

        /* must have lots of heal */
        if (borg.has[kv_potion_healing] < 5)
            return ("5 Heal");

        /* must have lots of ez-heal */
        if ((borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 15)
            return ("15 *heal* or life");

        /* must have lots of speed */
        if (borg.trait[BI_ASPEED] < 10)
            return ("10 speed potions");
    }

    /* Its good to be the king */
    if (depth <= 127)
        return ((char *)NULL);

    /* all bases covered */
    return ((char *)NULL);
}